

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

void gnu_clear_sparse_list(tar *tar)

{
  undefined8 *__ptr;
  long in_RDI;
  sparse_block *p;
  
  while (*(long *)(in_RDI + 0x138) != 0) {
    __ptr = *(undefined8 **)(in_RDI + 0x138);
    *(undefined8 *)(in_RDI + 0x138) = *__ptr;
    free(__ptr);
  }
  *(undefined8 *)(in_RDI + 0x140) = 0;
  return;
}

Assistant:

static void
gnu_clear_sparse_list(struct tar *tar)
{
	struct sparse_block *p;

	while (tar->sparse_list != NULL) {
		p = tar->sparse_list;
		tar->sparse_list = p->next;
		free(p);
	}
	tar->sparse_last = NULL;
}